

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewSequentialFile
          (PosixEnv *this,string *filename,SequentialFile **result)

{
  int iVar1;
  undefined8 *puVar2;
  int *piVar3;
  undefined8 *in_RCX;
  string asStack_48 [32];
  
  iVar1 = open((char *)*result,0x80000);
  if (iVar1 < 0) {
    *in_RCX = 0;
    piVar3 = __errno_location();
    PosixError((anon_unknown_1 *)this,(string *)result,*piVar3);
  }
  else {
    puVar2 = (undefined8 *)operator_new(0x30);
    std::__cxx11::string::string(asStack_48,(string *)result);
    *puVar2 = &PTR__PosixSequentialFile_00134b30;
    *(int *)(puVar2 + 1) = iVar1;
    std::__cxx11::string::string((string *)(puVar2 + 2),asStack_48);
    *in_RCX = puVar2;
    std::__cxx11::string::~string(asStack_48);
    (this->super_Env)._vptr_Env = (_func_int **)0x0;
  }
  return (Status)(char *)this;
}

Assistant:

Status NewSequentialFile(const std::string& filename,
                           SequentialFile** result) override {
    int fd = ::open(filename.c_str(), O_RDONLY | kOpenBaseFlags);
    if (fd < 0) {
      *result = nullptr;
      return PosixError(filename, errno);
    }

    *result = new PosixSequentialFile(filename, fd);
    return Status::OK();
  }